

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::Initialize(Solver *this,HyperParam *hyper_param)

{
  print_logo(this);
  checker(this,hyper_param);
  HyperParam::operator=(&this->hyper_param_,hyper_param);
  init_log(this);
  if ((this->hyper_param_).is_train == true) {
    init_train(this);
    return;
  }
  init_predict(this);
  return;
}

Assistant:

void Solver::Initialize(HyperParam& hyper_param) {
  // Print logo
  print_logo();
  // Check the arguments
  checker(hyper_param);
  this->hyper_param_ = hyper_param;
  // Initialize log file
  init_log();
  // Init train or predict
  if (hyper_param_.is_train) {
    init_train();
  } else {
    init_predict();
  }
}